

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O3

void __thiscall HighsLp::applyScale(HighsLp *this)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  
  if ((this->is_scaled_ == false) && (this->is_scaled_ = false, (this->scale_).has_scaling == true))
  {
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      pdVar2 = (this->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        pdVar4[lVar6] = pdVar4[lVar6] / pdVar2[lVar6];
        pdVar5[lVar6] = pdVar5[lVar6] / pdVar2[lVar6];
        pdVar3[lVar6] = pdVar2[lVar6] * pdVar3[lVar6];
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
    }
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      pdVar2 = (this->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        pdVar3[lVar6] = pdVar2[lVar6] * pdVar3[lVar6];
        pdVar4[lVar6] = pdVar2[lVar6] * pdVar4[lVar6];
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
    }
    HighsSparseMatrix::applyScale(&this->a_matrix_,&this->scale_);
    this->is_scaled_ = true;
  }
  return;
}

Assistant:

void HighsLp::applyScale() {
  // Ensure that any scaling is applied
  const HighsScale& scale = this->scale_;
  if (this->is_scaled_) {
    // Already scaled - so check that there is scaling and return
    assert(scale.has_scaling);
    return;
  }
  // No scaling currently applied
  this->is_scaled_ = false;
  if (scale.has_scaling) {
    // Apply the scaling to the bounds, costs and matrix, and record
    // that it has been applied
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      this->col_lower_[iCol] /= scale.col[iCol];
      this->col_upper_[iCol] /= scale.col[iCol];
      this->col_cost_[iCol] *= scale.col[iCol];
    }
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      this->row_lower_[iRow] *= scale.row[iRow];
      this->row_upper_[iRow] *= scale.row[iRow];
    }
    this->a_matrix_.applyScale(scale);
    this->is_scaled_ = true;
  }
}